

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

int parsedate(char *date,time_t *output)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int *piVar9;
  byte bVar10;
  int i;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  char **what;
  char **ppcVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_90;
  int local_8c;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  long *local_68;
  byte *local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar11 = -1;
  local_74 = -1;
  local_78 = -1;
  local_8c = -1;
  bVar5 = *date;
  local_90 = 0xffffffff;
  iVar15 = -1;
  iVar6 = -1;
  if (bVar5 != 0) {
    lVar18 = 0xffffffff;
    uVar12 = 0;
    local_90 = 0xffffffff;
    bVar3 = false;
    local_88 = 0xffffffff;
    local_68 = output;
    local_60 = (byte *)date;
    do {
      bVar10 = bVar5 & 0xdf;
      if ((byte)(bVar10 + 0xa5) < 0xe6 && (byte)(bVar5 - 0x3a) < 0xf6) {
        do {
          bVar5 = ((byte *)date)[1];
          date = (char *)((byte *)date + 1);
          bVar10 = bVar5 & 0xdf;
          if ((0xe5 < (byte)(bVar10 + 0xa5)) || (bVar5 == 0)) break;
        } while ((byte)(bVar5 - 0x3a) < 0xf6);
      }
      if ((byte)(bVar10 + 0xbf) < 0x1a) {
        local_48 = 0;
        uStack_40 = 0;
        local_58 = (byte *)0x0;
        uStack_50 = 0;
        local_70 = uVar12;
        iVar6 = __isoc99_sscanf(date,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                                &local_58);
        if (iVar6 == 0) {
          sVar8 = 0;
        }
        else {
          sVar8 = strlen((char *)&local_58);
        }
        if ((int)lVar18 == -1) {
          ppcVar16 = Curl_wkday;
          if (3 < sVar8) {
            ppcVar16 = weekday;
          }
          lVar18 = 0;
          do {
            iVar6 = Curl_strcasecompare((char *)&local_58,ppcVar16[lVar18]);
            if (iVar6 != 0) goto LAB_0055806d;
            lVar18 = lVar18 + 1;
          } while ((int)lVar18 != 7);
          lVar18 = 0xffffffff;
        }
        if (iVar11 == -1) {
          iVar11 = 0;
          ppcVar16 = Curl_month;
          do {
            iVar6 = Curl_strcasecompare((char *)&local_58,*ppcVar16);
            if (iVar6 != 0) goto LAB_0055806d;
            ppcVar16 = ppcVar16 + 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0xc);
          iVar11 = -1;
        }
        if (iVar15 != -1) {
          return -1;
        }
        lVar17 = 0;
        while (iVar6 = Curl_strcasecompare((char *)&local_58,tz[0].name + lVar17), iVar6 == 0) {
          lVar17 = lVar17 + 0xc;
          if ((int)lVar17 == 0x33c) {
            return -1;
          }
        }
        iVar15 = *(int *)(tz[0].name + lVar17 + 8) * 0x3c;
LAB_0055806d:
        uVar12 = local_70;
        date = (char *)((byte *)date + sVar8);
      }
      else if ((byte)(bVar5 - 0x30) < 10) {
        local_7c = 0;
        if (local_8c == -1) {
          iVar6 = __isoc99_sscanf(date,"%02d:%02d:%02d%n",&local_74,&local_78,&local_8c,&local_7c);
          if (iVar6 != 3) {
            if ((local_8c != -1) ||
               (iVar6 = __isoc99_sscanf(date,"%02d:%02d%n",&local_74,&local_78,&local_7c),
               iVar6 != 2)) goto LAB_00557e22;
            local_8c = 0;
          }
          date = (char *)((byte *)date + local_7c);
        }
        else {
LAB_00557e22:
          local_70 = uVar12;
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          *piVar9 = 0;
          lVar17 = strtol(date,(char **)&local_58,10);
          uVar12 = local_70;
          iVar7 = *piVar9;
          if (iVar7 != iVar6) {
            *piVar9 = iVar6;
          }
          if (iVar7 != 0) {
            return -1;
          }
          if (lVar17 - 0x80000000U < 0xffffffff00000000) {
            return -1;
          }
          uVar13 = curlx_sltosi(lVar17);
          lVar17 = (long)local_58 - (long)date;
          if (iVar15 == -1) {
            iVar15 = -1;
            bVar2 = false;
            if (((local_60 < date) && (bVar2 = false, lVar17 == 4)) && ((int)uVar13 < 0x579)) {
              bVar5 = ((byte *)date)[-1];
              lVar17 = 4;
              if ((bVar5 != 0x2d) && (bVar5 != 0x2b)) goto LAB_00557e9c;
              iVar6 = uVar13 + ((int)uVar13 / 100) * -0x28;
              iVar15 = iVar6 * -0x3c;
              if (bVar5 != 0x2b) {
                iVar15 = iVar6 * 0x3c;
              }
              bVar2 = true;
            }
          }
          else {
LAB_00557e9c:
            bVar2 = false;
          }
          if (((lVar17 == 8) && ((int)local_88 == -1)) &&
             ((iVar11 == -1 && (local_90 == 0xffffffff)))) {
            local_88 = (ulong)(uint)((int)uVar13 / 10000);
            iVar11 = (int)(short)((short)((short)uVar13 + (short)((int)uVar13 / 10000) * -10000) /
                                  100 + -1);
            local_90 = (int)uVar13 % 100;
            bVar2 = true;
          }
          bVar1 = (bool)(local_90 == 0xffffffff & !bVar3 & ~bVar2);
          bVar19 = uVar13 - 1 < 0x1f;
          uVar14 = 0xffffffff;
          if (bVar19) {
            uVar14 = uVar13;
          }
          bVar4 = true;
          if (!bVar1) {
            uVar14 = local_90;
            bVar4 = bVar3;
          }
          local_90 = uVar14;
          bVar19 = (bool)(bVar19 & bVar1);
          date = (char *)local_58;
          if (((bVar19 || bVar2) || (!bVar4)) || ((int)local_88 != -1)) {
            bVar3 = bVar4;
            if (!bVar19 && !bVar2) {
              return -1;
            }
          }
          else {
            if ((int)uVar13 < 100) {
              if ((int)uVar13 < 0x47) {
                uVar13 = uVar13 + 2000;
              }
              else {
                uVar13 = uVar13 + 0x76c;
              }
            }
            local_88 = (ulong)uVar13;
            bVar3 = local_90 != 0xffffffff;
          }
        }
      }
      bVar5 = *date;
    } while ((bVar5 != 0) && (uVar13 = (uint)uVar12, uVar12 = (ulong)(uVar13 + 1), uVar13 < 5));
    iVar6 = (int)local_88;
    output = local_68;
    if (local_8c != -1) goto LAB_005581f0;
  }
  local_8c = 0;
  local_74 = 0;
  local_78 = 0;
  local_68 = output;
LAB_005581f0:
  iVar7 = -1;
  if (((local_90 != 0xffffffff) && (iVar11 != -1)) &&
     ((0x62e < iVar6 &&
      ((local_8c < 0x3d && local_78 < 0x3c) &&
       (local_74 < 0x18 && (iVar11 < 0xc && (int)local_90 < 0x20)))))) {
    uVar13 = iVar6 - (uint)(iVar11 < 2);
    iVar7 = 0;
    if (iVar15 == -1) {
      iVar15 = 0;
    }
    *local_68 = (((long)local_74 +
                 ((long)(int)local_90 + (long)(iVar6 + -0x7b2) * 0x16d +
                  (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar11 * 4) +
                 (long)(int)(((uVar13 >> 2) - uVar13 / 100) + uVar13 / 400 + -0x1dd)) * 0x18) * 0x3c
                + (long)local_78) * 0x3c + (long)iVar15 + (long)local_8c + -0x15180;
  }
  return iVar7;
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}